

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

string * __thiscall kratos::FSM::dot_graph_abi_cxx11_(string *__return_storage_ptr__,FSM *this)

{
  size_t *psVar1;
  undefined8 this_00;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  void *this_01;
  ulong uVar5;
  mapped_type *pmVar6;
  element_type *peVar7;
  reference ppFVar8;
  reference ppVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  args_1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar10;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string local_818;
  string local_7f8;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_7d8;
  string local_7b8;
  string local_798;
  type *local_778;
  type *next_state;
  type *cond;
  FSMState *local_760;
  __normal_iterator<const_std::pair<kratos::Var_*,_kratos::FSMState_*>_*,_std::vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>_>
  local_758;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  *__range2;
  string state_name_1;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  *transitions;
  FSMState **state;
  iterator __end1_1;
  iterator __begin1_1;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__range1_1;
  undefined1 local_6d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> color_str_1;
  mapped_type color_1;
  string state_name;
  FSMState **iter;
  iterator __end1;
  iterator __begin1;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__range1;
  string local_650;
  undefined1 local_630 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> color_str;
  char local_604;
  remove_reference_t<unsigned_char_&> rStack_603;
  undefined1 local_602 [6];
  mapped_type color;
  map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
  state_colors;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  undefined1 local_598 [8];
  string start_state_name;
  stringstream local_568 [8];
  stringstream stream;
  char indent [5];
  FSM *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_3c8;
  basic_string_view<char> local_3b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  local_3a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_378;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *vargs_2;
  remove_reference_t<unsigned_char_&> *local_368;
  char (*local_360) [23];
  char *local_358;
  undefined1 *local_350;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_348;
  basic_string_view<char> local_338;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  local_328;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_2f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *vargs;
  remove_reference_t<unsigned_char_&> *local_2e8;
  char (*local_2e0) [23];
  char *local_2d8;
  undefined1 *local_2d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_2c8;
  basic_string_view<char> local_2b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_280;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char (*local_270) [75];
  char *local_268;
  string *local_260;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_258;
  basic_string_view<char> local_248;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_210;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  mapped_type *local_200;
  char *local_1f8;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> **local_1f0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1e8;
  basic_string_view<char> local_1d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_198;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_4;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *local_188;
  char (*local_180) [34];
  char *local_178;
  string *local_170;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_168;
  basic_string_view<char> local_158;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_120;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_5;
  char (*local_110) [16];
  char *local_108;
  string *local_100;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_e0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_d0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_c0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_90;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  stream._388_1_ = 0;
  stream._384_4_ = 0x20202020;
  std::__cxx11::stringstream::stringstream(local_568);
  poVar4 = std::operator<<((ostream *)&stream.field_0x8,"digraph ");
  poVar4 = std::operator<<(poVar4,(string *)this);
  poVar4 = std::operator<<(poVar4," {");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&stream.field_0x8,&stream.field_0x180);
  poVar4 = std::operator<<(poVar4,"rankdir=LR;");
  this_01 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)local_598);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->start_state_);
  if (bVar2) {
    peVar7 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->start_state_);
    FSMState::handle_name_abi_cxx11_
              ((string *)
               &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,peVar7);
    std::__cxx11::string::operator=
              ((string *)local_598,
               (string *)
               &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count,this,true);
  get_state_color((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                   *)(local_602 + 2),
                  (vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
                  &state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    color_str.field_2._8_8_ =
         std::__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>::get
                   (&(this->start_state_).
                     super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>);
    pmVar6 = std::
             map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
             ::at((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                   *)(local_602 + 2),(key_type *)((long)&color_str.field_2 + 8));
    local_602[0] = pmVar6->B;
    local_604 = pmVar6->R;
    unique0x00011f01 = pmVar6->G;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
             *)local_602;
    local_2e8 = &rStack_603;
    local_2d0 = local_630;
    local_2d8 = "#{0:02X}{1:02X}{2:02X}";
    local_2e0 = (char (*) [23])&local_604;
    fmt::v7::make_args_checked<unsigned_char&,unsigned_char&,unsigned_char&,char[23],char>
              (&local_328,(v7 *)"#{0:02X}{1:02X}{2:02X}",local_2e0,local_2e8,
               (remove_reference_t<unsigned_char_&> *)vargs,
               (remove_reference_t<unsigned_char_&> *)in_R9.values_);
    local_2f8 = &local_328;
    local_338 = fmt::v7::to_string_view<char,_0>(local_2d8);
    local_78 = &local_348;
    local_80 = local_2f8;
    local_50 = local_2f8;
    local_40 = local_2f8;
    local_48 = local_78;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_78,0x222,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_2f8);
    format_str.size_ = local_348.desc_;
    format_str.data_ = (char *)local_338.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_348.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_630,(detail *)local_338.data_,format_str,args);
    poVar4 = std::operator<<((ostream *)&stream.field_0x8,&stream.field_0x180);
    peVar7 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->start_state_);
    FSMState::handle_name_abi_cxx11_((string *)&__range1,peVar7);
    local_260 = &local_650;
    local_268 = "node [shape=doublecircle, label=\"{0}\", style=filled, fillcolor=\"{1}\"] {0};";
    local_270 = (char (*) [75])&__range1;
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_630;
    fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string&,char[75],char>
              (&local_2a8,
               (v7 *)
               "node [shape=doublecircle, label=\"{0}\", style=filled, fillcolor=\"{1}\"] {0};",
               local_270,(remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)local_348.field_1.values_);
    local_280 = &local_2a8;
    local_2b8 = fmt::v7::to_string_view<char,_0>(local_268);
    local_d0 = &local_2c8;
    local_d8 = local_280;
    local_c8 = local_280;
    local_88 = local_280;
    local_c0 = local_d0;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_d0,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_280);
    format_str_00.size_ = local_2c8.desc_;
    format_str_00.data_ = (char *)local_2b8.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_2c8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_650,(detail *)local_2b8.data_,format_str_00,args_00);
    poVar4 = std::operator<<(poVar4,(string *)&local_650);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::~string((string *)&__range1);
    std::__cxx11::string::~string((string *)local_630);
    in_R8 = local_2c8.field_1;
  }
  psVar1 = &state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::begin
                     ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)psVar1);
  iter = (FSMState **)
         std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::end
                   ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)psVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                                *)&iter);
    if (!bVar2) break;
    ppFVar8 = __gnu_cxx::
              __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
              ::operator*(&__end1);
    FSMState::handle_name_abi_cxx11_((string *)&color_1,*ppFVar8);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &color_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_598);
    if (_Var3) {
      color_str_1.field_2._12_4_ = 3;
    }
    else {
      pmVar6 = std::
               map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
               ::at((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                     *)(local_602 + 2),ppFVar8);
      color_str_1.field_2._M_local_buf[10] = pmVar6->B;
      color_str_1.field_2._8_1_ = pmVar6->R;
      color_str_1.field_2._9_1_ = pmVar6->G;
      vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_char,_unsigned_char,_unsigned_char>
                 *)(color_str_1.field_2._M_local_buf + 10);
      local_368 = (remove_reference_t<unsigned_char_&> *)(color_str_1.field_2._M_local_buf + 9);
      local_350 = local_6d8;
      local_358 = "#{0:02X}{1:02X}{2:02X}";
      local_360 = (char (*) [23])((long)&color_str_1.field_2 + 8);
      fmt::v7::make_args_checked<unsigned_char&,unsigned_char&,unsigned_char&,char[23],char>
                (&local_3a8,(v7 *)"#{0:02X}{1:02X}{2:02X}",local_360,local_368,
                 (remove_reference_t<unsigned_char_&> *)vargs_2,
                 (remove_reference_t<unsigned_char_&> *)in_R9.values_);
      local_378 = &local_3a8;
      bVar10 = fmt::v7::to_string_view<char,_0>(local_358);
      local_68 = &local_3c8;
      local_70 = local_378;
      local_60 = local_378;
      local_38 = local_378;
      local_58 = local_68;
      local_3b8 = bVar10;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_68,0x222,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_378);
      format_str_01.size_ = local_3c8.desc_;
      format_str_01.data_ = (char *)local_3b8.size_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_3c8.field_1.values_;
      args_1 = local_3c8.field_1;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_6d8,(detail *)local_3b8.data_,format_str_01,args_01);
      poVar4 = std::operator<<((ostream *)&stream.field_0x8,&stream.field_0x180);
      local_1f0 = &__range1_1;
      local_1f8 = "node [shape=circle, label=\"{0}\", style=filled, fillcolor=\"{1}\"] {0};";
      local_200 = &color_1;
      vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_6d8;
      fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string&,char[69],char>
                (&local_238,
                 (v7 *)"node [shape=circle, label=\"{0}\", style=filled, fillcolor=\"{1}\"] {0};",
                 (char (*) [69])local_200,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs_3,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)args_1.values_);
      local_210 = &local_238;
      bVar10 = fmt::v7::to_string_view<char,_0>(local_1f8);
      local_e0 = &local_258;
      local_e8 = local_210;
      local_b8 = local_210;
      local_90 = local_210;
      local_b0 = local_e0;
      local_248 = bVar10;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_e0,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_210);
      format_str_02.size_ = local_258.desc_;
      format_str_02.data_ = (char *)local_248.size_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_258.field_1.values_;
      in_R8 = local_258.field_1;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)&__range1_1,(detail *)local_248.data_,format_str_02,args_02);
      poVar4 = std::operator<<(poVar4,(string *)&__range1_1);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&__range1_1);
      std::__cxx11::string::~string((string *)local_6d8);
      color_str_1.field_2._12_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&color_1);
    __gnu_cxx::
    __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
    ::operator++(&__end1);
  }
  std::ostream::operator<<(&stream.field_0x8,std::endl<char,std::char_traits<char>>);
  psVar1 = &state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1_1 = std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::begin
                       ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)psVar1);
  state = (FSMState **)
          std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::end
                    ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)psVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                        *)&state);
    if (!bVar2) break;
    ppFVar8 = __gnu_cxx::
              __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
              ::operator*(&__end1_1);
    state_name_1.field_2._8_8_ = FSMState::transitions(*ppFVar8);
    FSMState::handle_name_abi_cxx11_((string *)&__range2,*ppFVar8);
    this_00 = state_name_1.field_2._8_8_;
    __end2 = std::
             vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
             ::begin((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                      *)state_name_1.field_2._8_8_);
    local_758._M_current =
         (pair<kratos::Var_*,_kratos::FSMState_*> *)
         std::
         vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
         ::end((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                *)this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&local_758);
      if (!bVar2) break;
      ppVar9 = __gnu_cxx::
               __normal_iterator<const_std::pair<kratos::Var_*,_kratos::FSMState_*>_*,_std::vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>_>
               ::operator*(&__end2);
      cond = (type *)ppVar9->first;
      local_760 = ppVar9->second;
      next_state = (type *)std::get<0ul,kratos::Var*,kratos::FSMState*>
                                     ((pair<kratos::Var_*,_kratos::FSMState_*> *)&cond);
      local_778 = std::get<1ul,kratos::Var*,kratos::FSMState*>
                            ((pair<kratos::Var_*,_kratos::FSMState_*> *)&cond);
      if (*next_state == (type)0x0) {
        poVar4 = std::operator<<((ostream *)&stream.field_0x8,&stream.field_0x180);
        FSMState::handle_name_abi_cxx11_(&local_818,*local_778);
        local_100 = &local_7f8;
        local_108 = "{0}    ->  {1};";
        local_110 = (char (*) [16])&__range2;
        vargs_5 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_818;
        fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string,char[16],char>
                  (&local_148,(v7 *)"{0}    ->  {1};",local_110,
                   (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs_5,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)in_R8.values_);
        local_120 = &local_148;
        bVar10 = fmt::v7::to_string_view<char,_0>(local_108);
        local_f0 = &local_168;
        local_f8 = local_120;
        local_a8 = local_120;
        local_98 = local_120;
        local_a0 = local_f0;
        local_158 = bVar10;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_f0,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_120);
        format_str_04.size_ = local_168.desc_;
        format_str_04.data_ = (char *)local_158.size_;
        args_04.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_04.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_168.field_1.values_;
        in_R8 = local_168.field_1;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_7f8,(detail *)local_158.data_,format_str_04,args_04);
        poVar4 = std::operator<<(poVar4,(string *)&local_7f8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::__cxx11::string::~string((string *)&local_818);
      }
      else {
        poVar4 = std::operator<<((ostream *)&stream.field_0x8,&stream.field_0x180);
        FSMState::handle_name_abi_cxx11_(&local_7b8,*local_778);
        (**(code **)((long)&((((*next_state)->super_enable_shared_from_this<kratos::FSMState>).
                              _M_weak_this.
                              super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->output_fn_ln_)._M_h._M_rehash_policy + 8))(&local_7d8);
        local_170 = &local_798;
        local_178 = "{0}    ->  {1} [ label = \"{2}\" ];";
        local_180 = (char (*) [34])&__range2;
        local_188 = &local_7b8;
        vargs_4 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_7d8;
        fmt::v7::
        make_args_checked<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string,char[34],char>
                  (&local_1c8,(v7 *)"{0}    ->  {1} [ label = \"{2}\" ];",local_180,local_188,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_4,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)in_R9.values_);
        local_198 = &local_1c8;
        bVar10 = fmt::v7::to_string_view<char,_0>(local_178);
        local_28 = &local_1e8;
        local_30 = local_198;
        local_20 = local_198;
        local_10 = local_198;
        local_18 = local_28;
        local_1d8 = bVar10;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_28,0xddd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_198);
        format_str_03.size_ = local_1e8.desc_;
        format_str_03.data_ = (char *)local_1d8.size_;
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_1e8.field_1.values_;
        in_R8 = local_1e8.field_1;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_798,(detail *)local_1d8.data_,format_str_03,args_03);
        poVar4 = std::operator<<(poVar4,(string *)&local_798);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_798);
        std::__cxx11::string::~string((string *)&local_7d8);
        std::__cxx11::string::~string((string *)&local_7b8);
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<kratos::Var_*,_kratos::FSMState_*>_*,_std::vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)&__range2);
    __gnu_cxx::
    __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
    ::operator++(&__end1_1);
  }
  poVar4 = std::operator<<((ostream *)&stream.field_0x8,"}");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  color_str_1.field_2._12_4_ = 1;
  std::
  map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
  ::~map((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
          *)(local_602 + 2));
  std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~vector
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)local_598);
  std::__cxx11::stringstream::~stringstream(local_568);
  return __return_storage_ptr__;
}

Assistant:

std::string FSM::dot_graph() {
    constexpr char indent[] = "    ";  // NOLINT
    std::stringstream stream;

    // header
    stream << "digraph " << fsm_name_ << " {" << endl;
    stream << indent << "rankdir=LR;" << ::endl << ::endl;

    // start state is double circle
    std::string start_state_name;
    if (start_state_) start_state_name = start_state_->handle_name();
    // we include extra states to draw the extra state transition diagram
    auto states = get_all_child_states(true);
    auto state_colors = get_state_color(states);
    if (!start_state_name.empty()) {
        auto color = state_colors.at(start_state_.get());
        auto color_str = ::format("#{0:02X}{1:02X}{2:02X}", color.R, color.G, color.B);
        stream
            << indent
            << ::format(
                   R"(node [shape=doublecircle, label="{0}", style=filled, fillcolor="{1}"] {0};)",
                   start_state_->handle_name(), color_str)
            << ::endl;
    }
    // the rest of the states
    for (auto const& iter : states) {
        auto state_name = iter->handle_name();
        if (state_name == start_state_name) continue;
        auto color = state_colors.at(iter);
        auto color_str = ::format("#{0:02X}{1:02X}{2:02X}", color.R, color.G, color.B);
        stream << indent
               << ::format(
                      R"(node [shape=circle, label="{0}", style=filled, fillcolor="{1}"] {0};)",
                      state_name, color_str)
               << ::endl;
    }

    stream << ::endl;
    // state transition
    for (auto const& state : states) {
        auto const &transitions = state->transitions();
        auto state_name = state->handle_name();
        // deterministic sorting
        for (auto [cond, next_state] : transitions) {
            if (cond) {
                stream << indent
                       << ::format("{0}    ->  {1} [ label = \"{2}\" ];", state_name,
                                   next_state->handle_name(), cond->to_string())
                       << ::endl;
            } else {
                stream << indent
                       << ::format("{0}    ->  {1};", state_name, next_state->handle_name())
                       << ::endl;
            }
        }
    }
    stream << "}" << ::endl;

    return stream.str();
}